

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

int run_test_fs_readdir_empty_dir(void)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  uv_dir_t *dir;
  int nb_entries_read;
  int r;
  uv_fs_t rmdir_req;
  uv_fs_t mkdir_req;
  char *path;
  
  uVar3 = uv_default_loop();
  uv_fs_mkdir(uVar3,&rmdir_req.bufsml[3].len,"./empty_dir/",0x1ff,0);
  uv_fs_req_cleanup(&rmdir_req.bufsml[3].len);
  memset(&opendir_req,0xdb,0x1b8);
  uVar3 = uv_default_loop();
  iVar2 = uv_fs_opendir(uVar3,&opendir_req,"./empty_dir/",0);
  pvVar1 = opendir_req.ptr;
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x76,"r == 0");
    abort();
  }
  if (opendir_req.fs_type != UV_FS_OPENDIR) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x77,"opendir_req.fs_type == UV_FS_OPENDIR");
    abort();
  }
  if (opendir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x78,"opendir_req.result == 0");
    abort();
  }
  if (opendir_req.ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x79,"opendir_req.ptr != NULL");
    abort();
  }
  uv_fs_req_cleanup(&opendir_req);
  memset(&readdir_req,0xdb,0x1b8);
  *(uv_dirent_t **)pvVar1 = dirents;
  *(undefined8 *)((long)pvVar1 + 8) = 1;
  uVar3 = uv_default_loop();
  iVar2 = uv_fs_readdir(uVar3,&readdir_req,pvVar1,0);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x85,"nb_entries_read == 0");
    abort();
  }
  uv_fs_req_cleanup(&readdir_req);
  memset(&closedir_req,0xdb,0x1b8);
  uVar3 = uv_default_loop();
  uv_fs_closedir(uVar3,&closedir_req,pvVar1,0);
  if (closedir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x8b,"closedir_req.result == 0");
    abort();
  }
  uv_fs_req_cleanup(&closedir_req);
  memset(&opendir_req,0xdb,0x1b8);
  memset(&readdir_req,0xdb,0x1b8);
  memset(&closedir_req,0xdb,0x1b8);
  uVar3 = uv_default_loop();
  iVar2 = uv_fs_opendir(uVar3,&opendir_req,"./empty_dir/",empty_opendir_cb);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x96,"r == 0");
    abort();
  }
  if (empty_opendir_cb_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x97,"empty_opendir_cb_count == 0");
    abort();
  }
  if (empty_closedir_cb_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x98,"empty_closedir_cb_count == 0");
    abort();
  }
  uVar3 = uv_default_loop();
  iVar2 = uv_run(uVar3,0);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x9a,"r == 0");
    abort();
  }
  if (empty_opendir_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x9b,"empty_opendir_cb_count == 1");
    abort();
  }
  if (empty_closedir_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x9c,"empty_closedir_cb_count == 1");
    abort();
  }
  uVar3 = uv_default_loop();
  uv_fs_rmdir(uVar3,&nb_entries_read,"./empty_dir/",0);
  uv_fs_req_cleanup(&nb_entries_read);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar2 = uv_loop_close(uVar3);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x9f,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_readdir_empty_dir) {
  const char* path;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  int r;
  int nb_entries_read;
  uv_dir_t* dir;

  path = "./empty_dir/";
  uv_fs_mkdir(uv_default_loop(), &mkdir_req, path, 0777, NULL);
  uv_fs_req_cleanup(&mkdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    path,
                    NULL);
  ASSERT(r == 0);
  ASSERT(opendir_req.fs_type == UV_FS_OPENDIR);
  ASSERT(opendir_req.result == 0);
  ASSERT(opendir_req.ptr != NULL);
  dir = opendir_req.ptr;
  uv_fs_req_cleanup(&opendir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&readdir_req, 0xdb, sizeof(readdir_req));
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  nb_entries_read = uv_fs_readdir(uv_default_loop(),
                                  &readdir_req,
                                  dir,
                                  NULL);
  ASSERT(nb_entries_read == 0);
  uv_fs_req_cleanup(&readdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&closedir_req, 0xdb, sizeof(closedir_req));
  uv_fs_closedir(uv_default_loop(), &closedir_req, dir, NULL);
  ASSERT(closedir_req.result == 0);
  uv_fs_req_cleanup(&closedir_req);

  /* Testing the asynchronous flavor. */

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));
  memset(&readdir_req, 0xdb, sizeof(readdir_req));
  memset(&closedir_req, 0xdb, sizeof(closedir_req));

  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, empty_opendir_cb);
  ASSERT(r == 0);
  ASSERT(empty_opendir_cb_count == 0);
  ASSERT(empty_closedir_cb_count == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(empty_opendir_cb_count == 1);
  ASSERT(empty_closedir_cb_count == 1);
  uv_fs_rmdir(uv_default_loop(), &rmdir_req, path, NULL);
  uv_fs_req_cleanup(&rmdir_req);
  MAKE_VALGRIND_HAPPY();
  return 0;
}